

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# check_code_options.c
# Opt level: O0

int check_block_sizes(test_state *state,int id,int id_len)

{
  int iVar1;
  char in_DL;
  uint in_ESI;
  undefined8 *in_RDI;
  int max_rsi;
  int rsi;
  int status;
  int bs;
  int local_28;
  int local_24;
  uint local_1c;
  
  local_1c = 8;
  do {
    if (0x40 < (int)local_1c) {
      return 0;
    }
    *(uint *)(in_RDI[0xb] + 0x34) = local_1c;
    local_28 = (int)((ulong)in_RDI[6] / (ulong)(long)(int)(local_1c * *(int *)((long)in_RDI + 0xc)))
    ;
    if (0x1000 < local_28) {
      local_28 = 0x1000;
    }
    for (local_24 = 1; local_24 <= local_28; local_24 = local_24 + 1) {
      *(int *)(in_RDI[0xb] + 0x38) = local_24;
      iVar1 = (*(code *)*in_RDI)(in_RDI);
      if (iVar1 != 0) {
        return iVar1;
      }
      if ((int)(uint)*(byte *)in_RDI[3] >> (8U - in_DL & 0x1f) != in_ESI) {
        printf("%s: block of size %i created with ID:%x, expected %x.\n","\x1b[0;31mFAIL\x1b[0m",
               (ulong)local_1c,(ulong)(uint)((int)(uint)*(byte *)in_RDI[3] >> (8U - in_DL & 0x1f)),
               (ulong)in_ESI);
        return 99;
      }
    }
    local_1c = local_1c << 1;
  } while( true );
}

Assistant:

int check_block_sizes(struct test_state *state, int id, int id_len)
{
    int bs, status, rsi, max_rsi;

    for (bs = 8; bs <= 64; bs *= 2) {
        state->strm->block_size = bs;

        max_rsi = (int)(state->buf_len / (bs * state->bytes_per_sample));
        if (max_rsi > 4096)
            max_rsi = 4096;

        for (rsi = 1; rsi <= max_rsi; rsi++) {
            state->strm->rsi = rsi;
            status = state->codec(state);
            if (status)
                return status;

            if ((state->cbuf[0] >> (8 - id_len)) != id) {
                printf(
                    "%s: block of size %i created with ID:%x, expected %x.\n",
                    CHECK_FAIL, bs, state->cbuf[0] >> (8 - id_len), id
                    );
                return 99;
            }
        }
    }
    return 0;
}